

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

bool __thiscall TrodesConfig::isValid(TrodesConfig *this)

{
  pointer pNVar1;
  bool bVar2;
  undefined1 extraout_AL;
  pointer *ppiVar3;
  value_type *pvVar4;
  value_type *__x;
  ulong uVar5;
  pointer pNVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  pNVar6 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = (value_type *)
           (((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pNVar6 >> 3) * -0x71c71c71c71c71c7);
  if (0 < (int)pvVar4) {
    lVar9 = 0;
    __x = (value_type *)0x0;
    do {
      if (pvVar4 <= __x) goto LAB_00208c9a;
      bVar2 = NDevice::isValid((NDevice *)
                               ((long)&(pNVar6->super_NetworkDataType)._vptr_NetworkDataType + lVar9
                               ));
      if (!bVar2) {
        return false;
      }
      __x = (value_type *)((long)&(__x->super_NetworkDataType)._vptr_NetworkDataType + 1);
      pNVar6 = (this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar4 = (value_type *)
               (((long)(this->devices).super__Vector_base<NDevice,_std::allocator<NDevice>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pNVar6 >> 3) * -0x71c71c71c71c71c7
               );
      lVar9 = lVar9 + 0x48;
    } while ((long)__x < (long)(int)pvVar4);
  }
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  __x = (value_type *)
        (((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pNVar1 >> 3) * -0x71c71c71c71c71c7);
  if ((int)(uint)__x < 1) {
    bVar2 = true;
  }
  else {
    uVar5 = (ulong)((uint)__x & 0x7fffffff);
    ppiVar3 = (pointer *)
              ((long)&(pNVar1->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    uVar7 = 0;
    do {
      if ((long)__x - uVar7 == 0) {
LAB_00208c9a:
        pcVar8 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        std::vector<NDevice,_std::allocator<NDevice>_>::push_back
                  ((vector<NDevice,_std::allocator<NDevice>_> *)(pcVar8 + 8),__x);
        return (bool)extraout_AL;
      }
      if (ppiVar3[-5] == (pointer)0x0) {
        return false;
      }
      if (((_Vector_impl_data *)(ppiVar3 + -1))->_M_start == *ppiVar3) {
        return false;
      }
      uVar7 = uVar7 + 1;
      ppiVar3 = ppiVar3 + 9;
    } while (uVar5 != uVar7);
    bVar2 = uVar5 <= uVar7;
  }
  return bVar2;
}

Assistant:

bool TrodesConfig::isValid() const {
//    std::cerr << "ISVALID check on TrodesConfig() " << this << "\n";
    // if (devices.empty()){ //there must always at least be an MCU
    //     std::cerr << "NO DEVICES\n";
    //     return(false);
    // }

    for (int i = 0; i < (int)devices.size(); i++) {
        if (!devices.at(i).isValid()){ //check that all devices are valid
            return(false);
        }
    }

    for (int i = 0; i < (int)nTrodes.size(); i++) {
        if (!nTrodes.at(i).isValid()){ //check that all added nTrodes are valid
            return(false);
        }
    }
    return(true);
}